

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNodeSetKeepLast(xmlNodeSetPtr set)

{
  xmlNodePtr ns;
  ulong uVar1;
  long lVar2;
  
  if (1 < set->nodeNr) {
    if (set->nodeNr < 2) {
      uVar1 = (ulong)(set->nodeNr - 1);
    }
    else {
      lVar2 = 0;
      do {
        ns = set->nodeTab[lVar2];
        if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        }
        lVar2 = lVar2 + 1;
        uVar1 = (long)set->nodeNr - 1;
      } while (lVar2 < (long)uVar1);
    }
    *set->nodeTab = set->nodeTab[(int)uVar1];
    set->nodeNr = 1;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetKeepLast(xmlNodeSetPtr set)
{
    int i;
    xmlNodePtr node;

    if ((set == NULL) || (set->nodeNr <= 1))
	return;
    for (i = 0; i < set->nodeNr - 1; i++) {
        node = set->nodeTab[i];
        if ((node != NULL) &&
            (node->type == XML_NAMESPACE_DECL))
            xmlXPathNodeSetFreeNs((xmlNsPtr) node);
    }
    set->nodeTab[0] = set->nodeTab[set->nodeNr-1];
    set->nodeNr = 1;
}